

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

void __thiscall
HullLibrary::BringOutYourDead
          (HullLibrary *this,btVector3 *verts,uint vcount,btVector3 *overts,uint *ocount,
          uint *indices,uint indexcount)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint *__s;
  long lVar5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  btAlignedObjectArray<int> tmpIndices;
  TUIntArray usedIndices;
  btAlignedObjectArray<int> local_70;
  btAlignedObjectArray<unsigned_int> local_50;
  
  local_70.m_ownsMemory = true;
  local_70.m_data = (int *)0x0;
  local_70.m_size = 0;
  local_70.m_capacity = 0;
  uVar1 = (this->m_vertexIndexMapping).m_size;
  if ((long)(int)uVar1 < 1) {
    local_70.m_capacity = 0;
    local_70.m_size = uVar1;
  }
  else {
    sVar8 = (long)(int)uVar1 << 2;
    piVar4 = (int *)btAlignedAllocInternal(sVar8,0x10);
    if ((long)local_70.m_size < 1) {
      if (local_70.m_data != (int *)0x0) goto LAB_00127e7a;
    }
    else {
      lVar5 = 0;
      do {
        piVar4[lVar5] = local_70.m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (local_70.m_size != lVar5);
LAB_00127e7a:
      if (local_70.m_ownsMemory == true) {
        btAlignedFreeInternal(local_70.m_data);
      }
    }
    local_70.m_ownsMemory = true;
    local_70.m_data = piVar4;
    local_70.m_capacity = uVar1;
    memset(piVar4,0,sVar8);
    local_70.m_size = uVar1;
    if (0 < (this->m_vertexIndexMapping).m_size) {
      piVar3 = (this->m_vertexIndexMapping).m_data;
      lVar5 = 0;
      do {
        piVar4[lVar5] = piVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->m_vertexIndexMapping).m_size);
    }
  }
  local_50.m_ownsMemory = true;
  __s = (uint *)0x0;
  local_50.m_data = (uint *)0x0;
  local_50.m_size = 0;
  local_50.m_capacity = 0;
  sVar8 = (ulong)vcount << 2;
  if ((int)vcount < 1) goto LAB_00127f55;
  __s = (uint *)btAlignedAllocInternal(sVar8,0x10);
  if ((long)local_50.m_size < 1) {
    if (local_50.m_data != (uint *)0x0) goto LAB_00127f28;
  }
  else {
    lVar5 = 0;
    do {
      __s[lVar5] = local_50.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (local_50.m_size != lVar5);
LAB_00127f28:
    if (local_50.m_ownsMemory == true) {
      btAlignedFreeInternal(local_50.m_data);
    }
  }
  local_50.m_ownsMemory = true;
  local_50.m_capacity = vcount;
  local_50.m_data = __s;
  memset(__s,0,sVar8);
LAB_00127f55:
  local_50.m_size = vcount;
  memset(__s,0,sVar8);
  *ocount = 0;
  if (0 < (int)indexcount) {
    uVar6 = 0;
    do {
      uVar1 = indices[uVar6];
      if (__s[(int)uVar1] == 0) {
        uVar2 = *ocount;
        indices[uVar6] = uVar2;
        overts[uVar2].m_floats[0] = verts[uVar1].m_floats[0];
        overts[uVar2].m_floats[1] = verts[uVar1].m_floats[1];
        overts[uVar2].m_floats[2] = verts[uVar1].m_floats[2];
        iVar7 = (this->m_vertexIndexMapping).m_size;
        if (0 < iVar7) {
          piVar4 = (this->m_vertexIndexMapping).m_data;
          lVar5 = 0;
          do {
            if (local_70.m_data[lVar5] == uVar1) {
              piVar4[lVar5] = uVar2;
              iVar7 = (this->m_vertexIndexMapping).m_size;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar7);
        }
        *ocount = uVar2 + 1;
        __s[(int)uVar1] = uVar2 + 1;
      }
      else {
        indices[uVar6] = __s[(int)uVar1] - 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != indexcount);
  }
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&local_50);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_70);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const btVector3* verts,unsigned int vcount, btVector3* overts,unsigned int &ocount,unsigned int *indices,unsigned indexcount)
{
	btAlignedObjectArray<int>tmpIndices;
	tmpIndices.resize(m_vertexIndexMapping.size());
	int i;

	for (i=0;i<m_vertexIndexMapping.size();i++)
	{
		tmpIndices[i] = m_vertexIndexMapping[i];
	}

	TUIntArray usedIndices;
	usedIndices.resize(static_cast<int>(vcount));
	memset(&usedIndices[0],0,sizeof(unsigned int)*vcount);

	ocount = 0;

	for (i=0; i<int (indexcount); i++)
	{
		unsigned int v = indices[i]; // original array index

		btAssert( v >= 0 && v < vcount );

		if ( usedIndices[static_cast<int>(v)] ) // if already remapped
		{
			indices[i] = usedIndices[static_cast<int>(v)]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount][0] = verts[v][0]; // copy old vert to new vert array
			overts[ocount][1] = verts[v][1];
			overts[ocount][2] = verts[v][2];

			for (int k=0;k<m_vertexIndexMapping.size();k++)
			{
				if (tmpIndices[k]==int(v))
					m_vertexIndexMapping[k]=ocount;
			}

			ocount++; // increment output vert count

			btAssert( ocount >=0 && ocount <= vcount );

			usedIndices[static_cast<int>(v)] = ocount; // assign new index remapping

		
		}
	}

	
}